

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O0

void bcread_ktabk(LexState *ls,TValue *o)

{
  lua_State *L;
  uint32_t uVar1;
  GCstr *pGVar2;
  double *in_RSI;
  char *in_RDI;
  char *p;
  MSize len;
  MSize tp;
  uint32_t v_3;
  uint32_t v_2;
  uint32_t v_1;
  uint32_t v;
  uint8_t *p_1;
  undefined4 in_stack_ffffffffffffff60;
  char *str;
  
  str = in_RDI;
  uVar1 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
  if (uVar1 < 5) {
    if (uVar1 == 3) {
      uVar1 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
      *in_RSI = (double)(int)uVar1;
    }
    else if (uVar1 == 4) {
      uVar1 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
      *(uint32_t *)in_RSI = uVar1;
      uVar1 = lj_buf_ruleb128((char **)(in_RDI + 0x20));
      *(uint32_t *)((long)in_RSI + 4) = uVar1;
    }
    else {
      *(uint32_t *)((long)in_RSI + 4) = uVar1 ^ 0xffffffff;
    }
  }
  else {
    L = *(lua_State **)(in_RDI + 0x20);
    *(ulong *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + (ulong)(uVar1 - 5);
    pGVar2 = lj_str_new(L,str,CONCAT44(uVar1,in_stack_ffffffffffffff60));
    *(uint32_t *)in_RSI = (uint32_t)pGVar2;
    *(uint32_t *)((long)in_RSI + 4) = 0xfffffffb;
  }
  return;
}

Assistant:

static void bcread_ktabk(LexState *ls, TValue *o)
{
  MSize tp = bcread_uleb128(ls);
  if (tp >= BCDUMP_KTAB_STR) {
    MSize len = tp - BCDUMP_KTAB_STR;
    const char *p = (const char *)bcread_mem(ls, len);
    setstrV(ls->L, o, lj_str_new(ls->L, p, len));
  } else if (tp == BCDUMP_KTAB_INT) {
    setintV(o, (int32_t)bcread_uleb128(ls));
  } else if (tp == BCDUMP_KTAB_NUM) {
    o->u32.lo = bcread_uleb128(ls);
    o->u32.hi = bcread_uleb128(ls);
  } else {
    lj_assertLS(tp <= BCDUMP_KTAB_TRUE, "bad constant type %d", tp);
    setpriV(o, ~tp);
  }
}